

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdftocsv.cpp
# Opt level: O1

void cdftocsv::doit(bool skipheader)

{
  FILE *pFVar1;
  int iVar2;
  char *rec;
  undefined8 extraout_RAX;
  int iVar3;
  int totalread;
  int iVar4;
  undefined7 in_register_00000039;
  ulong uVar5;
  uint *puVar6;
  int totalread_2;
  char *pcVar7;
  int *piVar8;
  int stream_type;
  vector<damagebindictionary,_std::allocator<damagebindictionary>_> damagebindictionary_vec;
  uint local_54;
  char *local_50;
  vector<damagebindictionary,_std::allocator<damagebindictionary>_> local_48;
  
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    fwrite("event_id,areaperil_id,vulnerability_id,bin_index,prob_to,bin_mean\n",0x42,1,_stdout);
  }
  local_48.super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getdamagebindictionary(&local_48);
  iVar3 = ((uint)((int)local_48.
                       super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (int)local_48.
                      super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>.
                      _M_impl.super__Vector_impl_data._M_start) >> 2) * 0x66666668 + 0x10;
  iVar4 = -1;
  if (-1 < iVar3) {
    iVar4 = iVar3;
  }
  uVar5 = 0x13890;
  if (local_48.super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      local_48.super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl
      .super__Vector_impl_data._M_start) {
    uVar5 = (long)iVar4;
  }
  rec = (char *)operator_new__(uVar5);
  pFVar1 = _stdin;
  puVar6 = &local_54;
  local_54 = 0;
  iVar4 = 0;
  while ((iVar4 != 4 && (iVar3 = getc(pFVar1), iVar3 != -1))) {
    *(char *)puVar6 = (char)iVar3;
    iVar4 = iVar4 + 1;
    puVar6 = (uint *)((long)puVar6 + 1);
  }
  if (local_54 != 1) {
    doit((cdftocsv *)(ulong)local_54);
    if (local_48.super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    _Unwind_Resume(extraout_RAX);
  }
  local_50 = rec + 0x10;
  do {
    pFVar1 = _stdin;
    pcVar7 = rec;
    for (iVar4 = 0; iVar4 != 0xc; iVar4 = iVar4 + 1) {
      iVar3 = getc(pFVar1);
      if (iVar3 == -1) {
        if (iVar4 != 0xc) {
          if (local_48.super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          return;
        }
        break;
      }
      *pcVar7 = (char)iVar3;
      pcVar7 = pcVar7 + 1;
    }
    pFVar1 = _stdin;
    iVar4 = 0;
    piVar8 = (int *)(rec + 0xc);
    while ((iVar4 != 4 && (iVar3 = getc(pFVar1), iVar3 != -1))) {
      *(char *)piVar8 = (char)iVar3;
      iVar4 = iVar4 + 1;
      piVar8 = (int *)((long)piVar8 + 1);
    }
    pFVar1 = _stdin;
    iVar4 = *(int *)(rec + 0xc);
    iVar3 = 0;
    pcVar7 = local_50;
    while ((iVar3 != iVar4 << 3 && (iVar2 = getc(pFVar1), iVar2 != -1))) {
      *pcVar7 = (char)iVar2;
      iVar3 = iVar3 + 1;
      pcVar7 = pcVar7 + 1;
    }
    processrec(rec);
  } while( true );
}

Assistant:

void doit(bool skipheader)
	{

		if (skipheader == false) fprintf(stdout, "event_id,areaperil_id,vulnerability_id,bin_index,prob_to,bin_mean\n");
		std::vector<damagebindictionary> damagebindictionary_vec;
		getdamagebindictionary(damagebindictionary_vec);
		size_t total_bins = damagebindictionary_vec.size();
		if (total_bins == 0) total_bins = 10000;
		int max_recsize = (int)(total_bins * sizeof(prob_mean)) + sizeof(damagecdfrec) + sizeof(int);

		char *rec = new char[max_recsize];
		int stream_type = 0;

		bool bSuccess = getrec((char *)&stream_type, stdin, sizeof(stream_type));

		if (stream_type != 1) {
			fprintf(stderr, "FATAL: Invalid stream type %d expect stream type 1\n", stream_type);
			exit(-1);
		}
		for (;;) {
			char *p = rec;
			bSuccess = getrec(p, stdin, sizeof(damagecdfrec));
			if (bSuccess == false) break;
			p = p + sizeof(damagecdfrec);
			bSuccess = getrec(p, stdin, sizeof(int)); // we now have bin count
			int *q = (int *)p;
			p = p + sizeof(int);
			int recsize = (*q) * sizeof(prob_mean);
			// we should now have damagecdfrec in memory
			bSuccess = getrec(p, stdin, recsize);
			recsize += sizeof(damagecdfrec) + sizeof(int);

			processrec(rec);
		}
	}